

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

FieldDescriptorArray * __thiscall
google::protobuf::util::MessageDifferencer::RetrieveFields
          (FieldDescriptorArray *__return_storage_ptr__,MessageDifferencer *this,Message *message,
          bool base_message)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  pointer *pppFVar1;
  pointer ppFVar2;
  iterator iVar3;
  int iVar4;
  undefined4 extraout_var;
  Reflection *this_01;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __last;
  long lVar6;
  long lVar7;
  FieldDescriptorArray *message_fields;
  long lVar5;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  lVar5 = CONCAT44(extraout_var,iVar4);
  this_00 = &this->tmp_message_fields_;
  ppFVar2 = (this->tmp_message_fields_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tmp_message_fields_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
    (this->tmp_message_fields_).
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppFVar2;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve(this_00,(long)*(int *)(lVar5 + 0x68) + 1);
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  if ((*(char *)(*(long *)(lVar5 + 0x20) + 0x4b) != '\x01') ||
     (this->scope_ == PARTIAL && base_message)) {
    Reflection::ListFields(this_01,message,this_00);
  }
  else {
    iVar4 = *(int *)(lVar5 + 0x68);
    if (0 < iVar4) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        message_fields = (FieldDescriptorArray *)(*(long *)(lVar5 + 0x28) + lVar6);
        iVar3._M_current =
             (this->tmp_message_fields_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->tmp_message_fields_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)this_00,iVar3,(FieldDescriptor **)&message_fields);
          iVar4 = *(int *)(lVar5 + 0x68);
        }
        else {
          *iVar3._M_current = (FieldDescriptor *)message_fields;
          pppFVar1 = &(this->tmp_message_fields_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x98;
      } while (lVar7 < iVar4);
    }
  }
  message_fields = (FieldDescriptorArray *)0x0;
  iVar3._M_current =
       (this->tmp_message_fields_).
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->tmp_message_fields_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)this_00,iVar3,(FieldDescriptor **)&message_fields);
    __last._M_current =
         (this->tmp_message_fields_).
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *iVar3._M_current = (FieldDescriptor *)0x0;
    __last._M_current =
         (this->tmp_message_fields_).
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->tmp_message_fields_).
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = __last._M_current;
  }
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::
  vector<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,void>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)__return_storage_ptr__,
             (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              )(this_00->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start,__last,(allocator_type *)&message_fields);
  return __return_storage_ptr__;
}

Assistant:

FieldDescriptorArray MessageDifferencer::RetrieveFields(const Message& message,
                                                        bool base_message) {
  const Descriptor* descriptor = message.GetDescriptor();

  tmp_message_fields_.clear();
  tmp_message_fields_.reserve(descriptor->field_count() + 1);

  const Reflection* reflection = message.GetReflection();
  if (descriptor->options().map_entry()) {
    if (this->scope_ == PARTIAL && base_message) {
      reflection->ListFields(message, &tmp_message_fields_);
    } else {
      // Map entry fields are always considered present.
      for (int i = 0; i < descriptor->field_count(); i++) {
        tmp_message_fields_.push_back(descriptor->field(i));
      }
    }
  } else {
    reflection->ListFields(message, &tmp_message_fields_);
  }
  // Add sentinel values to deal with the
  // case where the number of the fields in
  // each list are different.
  tmp_message_fields_.push_back(nullptr);

  FieldDescriptorArray message_fields(tmp_message_fields_.begin(),
                                      tmp_message_fields_.end());

  return message_fields;
}